

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv__is_buggy_cephfs(int fd)

{
  int iVar1;
  uint uVar2;
  undefined1 local_88 [8];
  statfs s;
  int fd_local;
  
  s.f_spare[3]._0_4_ = fd;
  iVar1 = fstatfs(fd,(statfs *)local_88);
  if (iVar1 == -1) {
    s.f_spare[3]._4_4_ = 0;
  }
  else if (local_88 == (undefined1  [8])0xc36400) {
    uVar2 = uv__kernel_version();
    s.f_spare[3]._4_4_ = (uint)(uVar2 < 0x41400);
  }
  else {
    s.f_spare[3]._4_4_ = 0;
  }
  return s.f_spare[3]._4_4_;
}

Assistant:

static int uv__is_buggy_cephfs(int fd) {
  struct statfs s;

  if (-1 == fstatfs(fd, &s))
    return 0;

  if (s.f_type != /* CephFS */ 0xC36400)
    return 0;

  return uv__kernel_version() < /* 4.20.0 */ 0x041400;
}